

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

uint32_t __thiscall
spirv_cross::CompilerMSL::build_msl_interpolant_type
          (CompilerMSL *this,uint32_t type_id,bool is_noperspective)

{
  uint32_t id;
  SPIRType *args;
  ID local_30;
  TypedID<(spirv_cross::Types)1> local_2c;
  SPIRType *local_28;
  SPIRType *type;
  byte local_15;
  uint32_t new_type_id;
  bool is_noperspective_local;
  CompilerMSL *pCStack_10;
  uint32_t type_id_local;
  CompilerMSL *this_local;
  
  local_15 = is_noperspective;
  new_type_id = type_id;
  pCStack_10 = this;
  id = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
  type._4_4_ = id;
  args = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,new_type_id);
  local_28 = Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>((Compiler *)this,id,args);
  local_28->basetype = Interpolant;
  TypedID<(spirv_cross::Types)1>::TypedID(&local_2c,new_type_id);
  (local_28->parent_type).id = local_2c.id;
  if ((local_15 & 1) != 0) {
    TypedID<(spirv_cross::Types)0>::TypedID(&local_30,type._4_4_);
    Compiler::set_decoration((Compiler *)this,local_30,DecorationNoPerspective,0);
  }
  return type._4_4_;
}

Assistant:

uint32_t CompilerMSL::build_msl_interpolant_type(uint32_t type_id, bool is_noperspective)
{
	uint32_t new_type_id = ir.increase_bound_by(1);
	SPIRType &type = set<SPIRType>(new_type_id, get<SPIRType>(type_id));
	type.basetype = SPIRType::Interpolant;
	type.parent_type = type_id;
	// In Metal, the pull-model interpolant type encodes perspective-vs-no-perspective in the type itself.
	// Add this decoration so we know which argument to pass to the template.
	if (is_noperspective)
		set_decoration(new_type_id, DecorationNoPerspective);
	return new_type_id;
}